

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test::
~SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test
          (SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredVariableInReturnThrows)
{
  std::string source = R"SRC(  
  fn test(): f32
  {
    ret x;
  }

  fn main(): f32
  {
    ret 0;
  }
  )SRC";
  throwTest(source);
}